

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

Option * __thiscall
CLI::App::add_flag_callback
          (App *this,string *flag_name,function<void_()> *function,string *flag_description)

{
  Option *pOVar1;
  callback_t fun;
  _Any_data local_c8;
  long local_b8;
  undefined8 local_b0;
  _Any_data local_a0;
  long local_90;
  undefined8 uStack_88;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  function<void_()> local_40;
  
  std::function<void_()>::function(&local_40,function);
  ::std::
  function<bool(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)>::
  function<CLI::App::add_flag_callback(std::__cxx11::string,std::function<void()>,std::__cxx11::string)::_lambda(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)_1_,void>
            ((function<bool(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)>
              *)local_a0._M_pod_data,(anon_class_32_1_3a3b9956 *)&local_40);
  std::_Function_base::~_Function_base(&local_40.super__Function_base);
  ::std::__cxx11::string::string((string *)&local_80,flag_name);
  local_c8._M_unused._M_object = (void *)0x0;
  local_c8._8_8_ = 0;
  local_b8 = 0;
  local_b0 = uStack_88;
  if (local_90 != 0) {
    local_c8._M_unused._M_object = local_a0._M_unused._M_object;
    local_c8._8_8_ = local_a0._8_8_;
    local_b8 = local_90;
    local_90 = 0;
    uStack_88 = 0;
  }
  ::std::__cxx11::string::string(&local_60,flag_description);
  pOVar1 = _add_flag_internal(this,&local_80,(callback_t *)&local_c8,&local_60);
  ::std::__cxx11::string::~string((string *)&local_60);
  std::_Function_base::~_Function_base((_Function_base *)&local_c8);
  ::std::__cxx11::string::~string((string *)&local_80);
  std::_Function_base::~_Function_base((_Function_base *)&local_a0);
  return pOVar1;
}

Assistant:

CLI11_INLINE Option *App::add_flag_callback(std::string flag_name,
                                            std::function<void(void)> function,  ///< A function to call, void(void)
                                            std::string flag_description) {

    CLI::callback_t fun = [function](const CLI::results_t &res) {
        using CLI::detail::lexical_cast;
        bool trigger{false};
        auto result = lexical_cast(res[0], trigger);
        if(result && trigger) {
            function();
        }
        return result;
    };
    return _add_flag_internal(flag_name, std::move(fun), std::move(flag_description));
}